

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderstate.h
# Opt level: O0

void __thiscall FRenderState::EnableClipLine(FRenderState *this,bool on)

{
  bool on_local;
  FRenderState *this_local;
  
  if ((gl.flags & 0x20) == 0) {
    this->mClipLineEnabled = on;
    if (on) {
      (*_ptrc_glEnable)(0x3000);
    }
    else {
      (*_ptrc_glDisable)(0x3000);
    }
  }
  return;
}

Assistant:

void EnableClipLine(bool on)
	{
		if (!(gl.flags & RFL_NO_CLIP_PLANES))
		{
			mClipLineEnabled = on;
			if (on)
			{
				glEnable(GL_CLIP_DISTANCE0);
			}
			else
			{
				glDisable(GL_CLIP_DISTANCE0);
			}
		}
	}